

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_factory.h
# Opt level: O1

shared_ptr<Shoes> __thiscall ProductRegistry::CreateLayer(ProductRegistry *this,ShoesParameter *p)

{
  pointer pcVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
  *this_00;
  const_iterator cVar2;
  mapped_type *pp_Var3;
  ostream *poVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<Shoes> sVar6;
  string type;
  key_type local_60;
  char *local_40;
  long local_38;
  
  pcVar1 = (p->type)._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (p->type)._M_string_length);
  this_00 = &Registry_abi_cxx11_()->_M_t;
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
          ::find(this_00,&local_60);
  if ((_Rb_tree_header *)cVar2._M_node != &(this_00->_M_impl).super__Rb_tree_header) {
    pp_Var3 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Shoes>_(*)(const_ShoesParameter_&)>_>_>
                            *)this_00,&local_60);
    (**pp_Var3)((ShoesParameter *)this);
    _Var5._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      _Var5._M_pi = extraout_RDX_00;
    }
    sVar6.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
    sVar6.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
    return (shared_ptr<Shoes>)sVar6.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Unknown shoes type: ",0x14);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," (known shoes types: ",0x15);
  TypeListString_abi_cxx11_();
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_40);
  exit(100);
}

Assistant:

static shared_ptr<Shoes> CreateLayer(const ShoesParameter& p) {
        string type = p.type;
        CreatorRegistry &registry = Registry();
        if (registry.count(type) == 0) {
            cout << "Unknown shoes type: " << type << " (known shoes types: " << TypeListString() << ")"<<endl;
            exit(100);
        }
        return registry[type](p);
    }